

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int act_strip(nt_opts *opts)

{
  int iVar1;
  nifti_image *nim;
  long lVar2;
  
  if (2 < g_debug) {
    act_strip_cold_1();
  }
  if ((opts->prefix == (char *)0x0) || ((opts->infiles).len == 1)) {
    if (0 < (opts->infiles).len) {
      lVar2 = 0;
      do {
        nim = nt_image_read(opts,(opts->infiles).list[lVar2],1);
        if (nim == (nifti_image *)0x0) {
          return 1;
        }
        nifti_free_extensions(nim);
        nim->descrip[0] = '\0';
        nim->descrip[1] = '\0';
        nim->descrip[2] = '\0';
        nim->descrip[3] = '\0';
        nim->descrip[4] = '\0';
        nim->descrip[5] = '\0';
        nim->descrip[6] = '\0';
        nim->descrip[7] = '\0';
        nim->descrip[8] = '\0';
        nim->descrip[9] = '\0';
        nim->descrip[10] = '\0';
        nim->descrip[0xb] = '\0';
        nim->descrip[0xc] = '\0';
        nim->descrip[0xd] = '\0';
        nim->descrip[0xe] = '\0';
        nim->descrip[0xf] = '\0';
        nim->descrip[0x10] = '\0';
        nim->descrip[0x11] = '\0';
        nim->descrip[0x12] = '\0';
        nim->descrip[0x13] = '\0';
        nim->descrip[0x14] = '\0';
        nim->descrip[0x15] = '\0';
        nim->descrip[0x16] = '\0';
        nim->descrip[0x17] = '\0';
        nim->descrip[0x18] = '\0';
        nim->descrip[0x19] = '\0';
        nim->descrip[0x1a] = '\0';
        nim->descrip[0x1b] = '\0';
        nim->descrip[0x1c] = '\0';
        nim->descrip[0x1d] = '\0';
        nim->descrip[0x1e] = '\0';
        nim->descrip[0x1f] = '\0';
        nim->descrip[0x20] = '\0';
        nim->descrip[0x21] = '\0';
        nim->descrip[0x22] = '\0';
        nim->descrip[0x23] = '\0';
        nim->descrip[0x24] = '\0';
        nim->descrip[0x25] = '\0';
        nim->descrip[0x26] = '\0';
        nim->descrip[0x27] = '\0';
        nim->descrip[0x28] = '\0';
        nim->descrip[0x29] = '\0';
        nim->descrip[0x2a] = '\0';
        nim->descrip[0x2b] = '\0';
        nim->descrip[0x2c] = '\0';
        nim->descrip[0x2d] = '\0';
        nim->descrip[0x2e] = '\0';
        nim->descrip[0x2f] = '\0';
        nim->descrip[0x30] = '\0';
        nim->descrip[0x31] = '\0';
        nim->descrip[0x32] = '\0';
        nim->descrip[0x33] = '\0';
        nim->descrip[0x34] = '\0';
        nim->descrip[0x35] = '\0';
        nim->descrip[0x36] = '\0';
        nim->descrip[0x37] = '\0';
        nim->descrip[0x38] = '\0';
        nim->descrip[0x39] = '\0';
        nim->descrip[0x3a] = '\0';
        nim->descrip[0x3b] = '\0';
        nim->descrip[0x3c] = '\0';
        nim->descrip[0x3d] = '\0';
        nim->descrip[0x3e] = '\0';
        nim->descrip[0x3f] = '\0';
        nim->descrip[0x40] = '\0';
        nim->descrip[0x41] = '\0';
        nim->descrip[0x42] = '\0';
        nim->descrip[0x43] = '\0';
        nim->descrip[0x44] = '\0';
        nim->descrip[0x45] = '\0';
        nim->descrip[0x46] = '\0';
        nim->descrip[0x47] = '\0';
        nim->descrip[0x48] = '\0';
        nim->descrip[0x49] = '\0';
        nim->descrip[0x4a] = '\0';
        nim->descrip[0x4b] = '\0';
        nim->descrip[0x4c] = '\0';
        nim->descrip[0x4d] = '\0';
        nim->descrip[0x4e] = '\0';
        nim->descrip[0x4f] = '\0';
        if ((opts->prefix != (char *)0x0) &&
           (iVar1 = nifti_set_filenames(nim,opts->prefix,(uint)(opts->overwrite == 0),1), iVar1 != 0
           )) {
          nifti_image_free(nim);
          return 1;
        }
        if (1 < g_debug) {
          act_strip_cold_2();
        }
        nifti_image_write(nim);
        if (3 < g_debug) {
          nifti_image_infodump(nim);
        }
        nifti_image_free(nim);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (opts->infiles).len);
    }
    iVar1 = 0;
    if (0 < g_debug) {
      iVar1 = 0;
      fprintf(_stderr,"+d stripped extras from %d files\n");
    }
  }
  else {
    fprintf(_stderr,"** error: we have a prefix but %d files\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int act_strip( nt_opts * opts )
{
   nifti_image      * nim;
   int                fc;

   if( g_debug > 2 )
      fprintf(stderr,"+d stripping extras from %d files\n", opts->infiles.len);

   if( opts->prefix && opts->infiles.len != 1 ){
      fprintf(stderr,"** error: we have a prefix but %d files\n",
              opts->infiles.len);
      return 1;
   }

   for( fc = 0; fc < opts->infiles.len; fc++ )
   {
      nim = nt_image_read( opts, opts->infiles.list[fc], 1 );
      if( !nim ) return 1;  /* errors come from the library */

      /* now remove the extensions */
      nifti_free_extensions(nim);
      memset(nim->descrip, 0, 80);

      if( opts->prefix &&
          nifti_set_filenames(nim, opts->prefix, !opts->overwrite, 1) ){
         nifti_image_free(nim);
         return 1;
      }

      if( g_debug > 1 )
         fprintf(stderr,"+d writing %s without extensions or 'descrip'\n",
                 nim->fname);

      nifti_image_write(nim);

      if( g_debug > 3 ) nifti_image_infodump(nim);
      nifti_image_free(nim);
   }

   if( g_debug > 0 )
      fprintf(stderr,"+d stripped extras from %d files\n", opts->infiles.len);

   return 0;
}